

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::Trim(ON_PolylineCurve *this,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  ON_3dPoint from_pt;
  ON_3dPoint from_pt_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  ON_3dPoint *pOVar8;
  ON_3dPoint *pOVar9;
  ON_3dPoint *pOVar10;
  ON_SimpleArray<double> *this_00;
  ON_3dPoint local_278;
  double local_260;
  double np;
  double dStack_250;
  double local_248;
  double local_238;
  double dStack_230;
  double local_228;
  undefined1 local_218 [8];
  ON_Line seg_chord_1;
  ON_3dPoint Q1_1;
  undefined1 auStack_1c8 [8];
  ON_3dPoint Q0_1;
  undefined1 local_1a8 [8];
  ON_Interval seg_domain_1;
  ON_3dPoint local_190;
  ON_3dPoint local_178;
  byte local_14a;
  byte local_149;
  bool bSet1;
  double dStack_148;
  bool bSet0;
  double np1;
  double np0;
  double dStack_130;
  double local_128;
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [8];
  ON_Line seg_chord;
  ON_3dPoint Q1;
  undefined1 auStack_a8 [8];
  ON_3dPoint Q0;
  ON_Interval seg_domain;
  bool bTrimLastSegment;
  bool bTrimFirstSegment;
  ON_3dPoint *tmp_P;
  double *tmp_t;
  int s1;
  int s0;
  int j;
  int i;
  ON_Interval actual_trim_domain;
  ON_Interval output_domain;
  ON_Interval original_polyline_domain;
  int segment_count;
  ON_Interval *domain_local;
  ON_PolylineCurve *this_local;
  
  iVar4 = ON_SimpleArray<double>::Count(&this->m_t);
  original_polyline_domain.m_t[1]._4_4_ = iVar4 + -1;
  if (0 < original_polyline_domain.m_t[1]._4_4_) {
    iVar5 = ON_SimpleArray<double>::Count(&this->m_t);
    iVar6 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    if ((iVar5 == iVar6) && (bVar3 = ON_Interval::IsIncreasing(domain), bVar3)) {
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
      bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(output_domain.m_t + 1));
      if (bVar3) {
        actual_trim_domain.m_t[1] = domain->m_t[0];
        output_domain.m_t[0] = domain->m_t[1];
        bVar3 = ON_Interval::Intersection
                          ((ON_Interval *)(actual_trim_domain.m_t + 1),
                           (ON_Interval *)(output_domain.m_t + 1));
        if (bVar3) {
          bVar3 = ON_Interval::IsIncreasing((ON_Interval *)(actual_trim_domain.m_t + 1));
          if (bVar3) {
            _j = actual_trim_domain.m_t[1];
            actual_trim_domain.m_t[0] = output_domain.m_t[0];
            tmp_t._4_4_ = -2;
            tmp_t._0_4_ = -3;
            pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
            bVar3 = ParameterSearch(this,*pdVar7,(int *)((long)&tmp_t + 4),true);
            if (((bVar3) && (-1 < tmp_t._4_4_)) &&
               (tmp_t._4_4_ <= original_polyline_domain.m_t[1]._4_4_)) {
              pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,tmp_t._4_4_);
              dVar1 = *pdVar7;
              pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
              *pdVar7 = dVar1;
            }
            pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
            bVar3 = ParameterSearch(this,*pdVar7,(int *)&tmp_t,true);
            if (((bVar3) && (-1 < (int)tmp_t)) &&
               ((int)tmp_t <= original_polyline_domain.m_t[1]._4_4_)) {
              pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t);
              dVar1 = *pdVar7;
              pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
              *pdVar7 = dVar1;
              tmp_t._0_4_ = (int)tmp_t + -1;
            }
            bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&j);
            if (bVar3) {
              if (((tmp_t._4_4_ < 0) || ((int)tmp_t < tmp_t._4_4_)) ||
                 (original_polyline_domain.m_t[1]._4_4_ <= (int)tmp_t)) {
                this_local._7_1_ = 0;
              }
              else {
                ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
                bVar3 = ON_Interval::operator==
                                  ((ON_Interval *)&j,(ON_Interval *)(output_domain.m_t + 1));
                if (bVar3) {
                  pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
                  dVar1 = *pdVar7;
                  pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  *pdVar7 = dVar1;
                  pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
                  dVar1 = *pdVar7;
                  pdVar7 = ON_SimpleArray<double>::operator[]
                                     (&this->m_t,original_polyline_domain.m_t[1]._4_4_);
                  *pdVar7 = dVar1;
                  this_local._7_1_ = 1;
                }
                else {
                  if ((int)tmp_t < iVar4 + -2) {
                    ON_SimpleArray<double>::SetCount(&this->m_t,(int)tmp_t + 2);
                    ON_SimpleArray<ON_3dPoint>::SetCount
                              ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t + 2);
                    original_polyline_domain.m_t[1]._4_4_ = (int)tmp_t + 1;
                  }
                  if (0 < tmp_t._4_4_) {
                    pdVar7 = ON_SimpleArray<double>::Array(&this->m_t);
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::Array
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
                    s0 = 0;
                    for (s1 = tmp_t._4_4_; s1 <= original_polyline_domain.m_t[1]._4_4_; s1 = s1 + 1)
                    {
                      pdVar7[s0] = pdVar7[s1];
                      pOVar10 = pOVar8 + s1;
                      pOVar9 = pOVar8 + s0;
                      pOVar9->x = pOVar10->x;
                      pOVar9->y = pOVar10->y;
                      pOVar9->z = pOVar10->z;
                      s0 = s0 + 1;
                    }
                    tmp_t._0_4_ = (int)tmp_t - tmp_t._4_4_;
                    tmp_t._4_4_ = 0;
                    ON_SimpleArray<double>::SetCount(&this->m_t,(int)tmp_t + 2);
                    ON_SimpleArray<ON_3dPoint>::SetCount
                              ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t + 2);
                  }
                  pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  dVar1 = *pdVar7;
                  pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                  bVar3 = true;
                  if ((*pdVar7 <= dVar1) && (bVar3 = false, (int)tmp_t == 0)) {
                    pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                    bVar3 = dVar1 < *pdVar7;
                  }
                  bVar2 = false;
                  if (tmp_t._4_4_ < (int)tmp_t) {
                    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                    bVar2 = false;
                    if (dVar1 < *pdVar7) {
                      pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                      dVar1 = *pdVar7;
                      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t + 1);
                      bVar2 = dVar1 < *pdVar7;
                    }
                  }
                  if (bVar3) {
                    this_00 = &this->m_t;
                    pdVar7 = ON_SimpleArray<double>::operator[](this_00,0);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_SimpleArray<double>::operator[](this_00,1);
                    ON_Interval::ON_Interval((ON_Interval *)&Q0.z,dVar1,*pdVar7);
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
                    Q0.y = pOVar8->z;
                    auStack_a8 = (undefined1  [8])pOVar8->x;
                    Q0.x = pOVar8->y;
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,1);
                    Q1.y = pOVar8->z;
                    np0 = pOVar8->x;
                    Q1.x = pOVar8->y;
                    local_108 = Q0.y;
                    local_118 = (double)auStack_a8;
                    dStack_110 = Q0.x;
                    from_pt.y = Q0.x;
                    from_pt.x = (double)auStack_a8;
                    from_pt.z = Q0.y;
                    dStack_130 = Q1.x;
                    local_128 = Q1.y;
                    seg_chord.to.z = np0;
                    ON_Line::ON_Line((ON_Line *)local_f8,from_pt,*pOVar8);
                    np1 = 0.0;
                    dStack_148 = 1.0;
                    local_149 = 0;
                    local_14a = 0;
                    pdVar7 = ON_SimpleArray<double>::operator[](this_00,0);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                    if (dVar1 < *pdVar7) {
                      pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                      dVar1 = *pdVar7;
                      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                      if (dVar1 < *pdVar7) {
                        pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                        np1 = ON_Interval::NormalizedParameterAt((ON_Interval *)&Q0.z,*pdVar7);
                        ON_Line::PointAt(&local_178,(ON_Line *)local_f8,np1);
                        auStack_a8 = (undefined1  [8])local_178.x;
                        Q0.x = local_178.y;
                        Q0.y = local_178.z;
                        local_149 = 1;
                      }
                    }
                    if ((int)tmp_t == 0) {
                      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                      dVar1 = *pdVar7;
                      pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                      if (dVar1 < *pdVar7) {
                        pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                        dVar1 = *pdVar7;
                        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                        if (dVar1 < *pdVar7) {
                          pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                          dStack_148 = ON_Interval::NormalizedParameterAt
                                                 ((ON_Interval *)&Q0.z,*pdVar7);
                          ON_Line::PointAt(&local_190,(ON_Line *)local_f8,dStack_148);
                          seg_chord.to.z = local_190.x;
                          Q1.x = local_190.y;
                          Q1.y = local_190.z;
                          local_14a = 1;
                        }
                      }
                    }
                    if (np1 < dStack_148) {
                      if ((local_149 & 1) != 0) {
                        if (((0.9999999850988388 <= np1) &&
                            (dVar1 = ON_3dPoint::DistanceTo
                                               ((ON_3dPoint *)auStack_a8,
                                                (ON_3dPoint *)&seg_chord.to.z),
                            dVar1 <= 2.3283064365386963e-10)) && (0 < (int)tmp_t)) {
                          pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                          dVar1 = *pdVar7;
                          pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                          if (dVar1 < *pdVar7) {
                            ON_SimpleArray<double>::Remove(&this->m_t,0);
                            ON_SimpleArray<ON_3dPoint>::Remove
                                      ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
                            tmp_t._0_4_ = (int)tmp_t + -1;
                            pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                            dVar1 = *pdVar7;
                            pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                            *pdVar7 = dVar1;
                          }
                        }
                        pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,0);
                        dVar1 = *pdVar7;
                        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                        *pdVar7 = dVar1;
                        pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
                        pOVar8->x = (double)auStack_a8;
                        pOVar8->y = Q0.x;
                        pOVar8->z = Q0.y;
                      }
                      if ((local_14a & 1) != 0) {
                        pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                        dVar1 = *pdVar7;
                        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,1);
                        *pdVar7 = dVar1;
                        pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,1);
                        pOVar8->x = seg_chord.to.z;
                        pOVar8->y = Q1.x;
                        pOVar8->z = Q1.y;
                      }
                      seg_domain_1.m_t[1]._4_4_ = 0;
                    }
                    else {
                      this_local._7_1_ = 0;
                      seg_domain_1.m_t[1]._4_4_ = 1;
                    }
                    ON_Line::~ON_Line((ON_Line *)local_f8);
                    if (seg_domain_1.m_t[1]._4_4_ != 0) goto LAB_0080d42c;
                  }
                  if (bVar2) {
                    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t + 1);
                    ON_Interval::ON_Interval((ON_Interval *)local_1a8,dVar1,*pdVar7);
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t);
                    Q0_1.y = pOVar8->z;
                    auStack_1c8 = (undefined1  [8])pOVar8->x;
                    Q0_1.x = pOVar8->y;
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t + 1)
                    ;
                    local_248 = pOVar8->z;
                    np = pOVar8->x;
                    dStack_250 = pOVar8->y;
                    local_228 = Q0_1.y;
                    local_238 = (double)auStack_1c8;
                    dStack_230 = Q0_1.x;
                    from_pt_00.y = Q0_1.x;
                    from_pt_00.x = (double)auStack_1c8;
                    from_pt_00.z = Q0_1.y;
                    seg_chord_1.to.z = np;
                    ON_Line::ON_Line((ON_Line *)local_218,from_pt_00,*pOVar8);
                    pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                    local_260 = ON_Interval::NormalizedParameterAt((ON_Interval *)local_1a8,*pdVar7)
                    ;
                    ON_Line::PointAt(&local_278,(ON_Line *)local_218,local_260);
                    seg_chord_1.to.z = local_278.x;
                    if (((local_260 <= 1.490116119385e-08) &&
                        (dVar1 = ON_3dPoint::DistanceTo
                                           ((ON_3dPoint *)&seg_chord_1.to.z,
                                            (ON_3dPoint *)auStack_1c8),
                        dVar1 <= 2.3283064365386963e-10)) && (0 < (int)tmp_t)) {
                      ON_SimpleArray<ON_3dPoint>::SetCount
                                ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t + 1);
                      ON_SimpleArray<double>::SetCount(&this->m_t,(int)tmp_t + 1);
                      iVar4 = (int)tmp_t;
                      tmp_t._0_4_ = (int)tmp_t + -1;
                      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,iVar4);
                      dVar1 = *pdVar7;
                      pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                      *pdVar7 = dVar1;
                    }
                    pdVar7 = ON_Interval::operator[]((ON_Interval *)&j,1);
                    dVar1 = *pdVar7;
                    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,(int)tmp_t + 1);
                    *pdVar7 = dVar1;
                    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,(int)tmp_t + 1)
                    ;
                    pOVar8->x = seg_chord_1.to.z;
                    pOVar8->y = local_278.y;
                    pOVar8->z = local_278.z;
                    ON_Line::~ON_Line((ON_Line *)local_218);
                  }
                  pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),0);
                  dVar1 = *pdVar7;
                  pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
                  *pdVar7 = dVar1;
                  pdVar7 = ON_Interval::operator[]((ON_Interval *)(actual_trim_domain.m_t + 1),1);
                  dVar1 = *pdVar7;
                  iVar4 = ON_SimpleArray<double>::Count(&this->m_t);
                  pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,iVar4 + -1);
                  *pdVar7 = dVar1;
                  this_local._7_1_ = 1;
                }
              }
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
      goto LAB_0080d42c;
    }
  }
  this_local._7_1_ = 0;
LAB_0080d42c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_PolylineCurve::Trim( const ON_Interval& domain )
{
  int segment_count = m_t.Count()-1;

	if ( segment_count < 1 || m_t.Count() != m_pline.Count() || !domain.IsIncreasing() )
    return false;

  const ON_Interval original_polyline_domain = Domain();
  if ( !original_polyline_domain.IsIncreasing() )
    return false;
  
  ON_Interval output_domain = domain;
  if ( !output_domain.Intersection(original_polyline_domain) )
    return false;
	if(!output_domain.IsIncreasing())
		return false;

  ON_Interval actual_trim_domain = output_domain;

  int i, j;
  int s0 = -2; // s0 gets set to index of first segment we keep
  int s1 = -3; // s1 gets set to index of last segment we keep
  
	if ( ParameterSearch(output_domain[0], s0, true ) )
  {
    // ParameterSearch says domain[0] is within "microtol" of
    // m_t[s0].  So we will actually trim at m_t[s0].
    if (s0 >= 0 && s0 <= segment_count)
    {
      actual_trim_domain[0]=m_t[s0];
    }
  }

	if ( ParameterSearch(output_domain[1], s1, true ) )
  {
    if (s1 >= 0 && s1 <= segment_count )
    {
      // ParameterSearch says domain[1] is within "microtol" of
      // m_t[s1].  So we will actually trim at m_t[s1].
      actual_trim_domain[1]=m_t[s1];
      s1--;
    }
  }

  if ( !actual_trim_domain.IsIncreasing() )
  {
    // After microtol snapping, there is not enough curve left to trim.
    return false;
  }

  if ( s0 < 0 || s0 > s1 || s1 >= segment_count )
  {
    // Because output_domain is a subinterval of original_polyline_domain,
    // the only way that (s0 < 0 || s0 > s1 || s1 >= segment_count) can be true
    // is if something is seriously wrong with the m_t[] values.
    return false;
  }

  // we will begin modifying the polyline
  DestroyCurveTree();

  if ( actual_trim_domain == original_polyline_domain )
  {
    // ParameterSearch says that the ends of output_domain
    // were microtol away from being the entire curve.  
    // Set the domain and return.
    m_t[0] = output_domain[0];
    m_t[segment_count] = output_domain[1];
    return true;
  }

  if ( s1 < segment_count-1 )
  {
    m_t.SetCount(s1+2);
    m_pline.SetCount(s1+2);
    segment_count = s1+1;
  }

  if ( s0 > 0 )
  {
    double* tmp_t = m_t.Array();
    ON_3dPoint* tmp_P = m_pline.Array();
    for ( i = 0, j = s0; j <= segment_count; i++, j++ )
    {
      tmp_t[i] = tmp_t[j];
      tmp_P[i] = tmp_P[j];
    }
    s1 -= s0;
    s0 = 0;
    m_t.SetCount(s1+2);
    m_pline.SetCount(s1+2);
    segment_count = s1+1;
  }

  bool bTrimFirstSegment = ( m_t[0] < actual_trim_domain[0] || (0 == s1 && actual_trim_domain[1] < m_t[1]) );
  bool bTrimLastSegment = (s1>s0 && m_t[s1] < actual_trim_domain[1] && actual_trim_domain[1] < m_t[s1+1]);

  if ( bTrimFirstSegment )
  {
    ON_Interval seg_domain(m_t[0],m_t[1]);
    ON_3dPoint Q0 = m_pline[0];
    ON_3dPoint Q1 = m_pline[1];
    ON_Line seg_chord(Q0,Q1);
    double np0 = 0.0;
    double np1 = 1.0;
    bool bSet0 = false;
    bool bSet1 = false;
    if ( m_t[0] < actual_trim_domain[0] && actual_trim_domain[0] < m_t[1] )
    {
      np0 = seg_domain.NormalizedParameterAt(actual_trim_domain[0]);
      Q0 = seg_chord.PointAt( np0 );
      bSet0 = true;
    }
    if ( 0 == s1 && m_t[0] < actual_trim_domain[1] && actual_trim_domain[1] < m_t[1] )
    {
      np1 = seg_domain.NormalizedParameterAt(actual_trim_domain[1]);
      Q1 = seg_chord.PointAt( np1 );
      bSet1 = true;
    }
    
    if ( np0 >= np1 )
      return false; // trim is not viable

    if ( bSet0 )
    {
      if ( np0 >= 1.0-ON_SQRT_EPSILON && Q0.DistanceTo(Q1) <= ON_ZERO_TOLERANCE && s1>0 && m_t[1] < actual_trim_domain[1] )
      {
        // trim will leave a micro segment at the start - just remove the first segment
        m_t.Remove(0);
        m_pline.Remove(0);
        s1--;
        segment_count--;
        actual_trim_domain[0] = m_t[0];
      }
      m_t[0] = actual_trim_domain[0];
      m_pline[0] = Q0;
    }
    if ( bSet1 )
    {
      m_t[1] = actual_trim_domain[1];
      m_pline[1] = Q1;
    }
  }

  if ( bTrimLastSegment )
  {
    ON_Interval seg_domain(m_t[s1],m_t[s1+1]);
    ON_3dPoint Q0 = m_pline[s1];
    ON_3dPoint Q1 = m_pline[s1+1];
    ON_Line seg_chord(Q0,Q1);
    double np = seg_domain.NormalizedParameterAt(actual_trim_domain[1]);
    Q1 = seg_chord.PointAt(np);
    if ( np <= ON_SQRT_EPSILON && Q1.DistanceTo(Q0) <= ON_ZERO_TOLERANCE && s1 > 0 )
    {
        // trim will leave a micro segment at the end - just remove the last segment
      m_pline.SetCount(s1+1);
      m_t.SetCount(s1+1);
      s1--;
      segment_count--;
      actual_trim_domain[1] = m_t[s1+1];
    }
    m_t[s1+1] = actual_trim_domain[1];
    m_pline[s1+1] = Q1;
  }

  // If we get this far, trims were is successful.
  // The following makes potential tiny adjustments
  // that need to happen when trims get snapped to
  // input m_t[] values that are within fuzz of the
  // output_domain[] values.
	m_t[0] = output_domain[0];
  m_t[m_t.Count()-1] = output_domain[1];

  return true;
}